

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall
HEkk::debugOkForSolve(HEkk *this,SimplexAlgorithm algorithm,HighsInt phase)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  const_reference pvVar5;
  long in_RDI;
  HighsInt var;
  HighsInt numTot;
  bool ok;
  HighsOptions *options;
  SimplexBasis *basis;
  HighsSimplexStatus *status;
  HighsLp *lp;
  HighsDebugStatus return_status;
  HighsInt in_stack_00000100;
  SimplexAlgorithm in_stack_00000104;
  HEkk *in_stack_00000108;
  HighsInt in_stack_00000164;
  HEkk *in_stack_00000168;
  byte local_59;
  int local_4c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  HighsDebugStatus HVar6;
  
  if (*(int *)(*(long *)(in_RDI + 8) + 0x15c) < 1) {
    HVar6 = kNotChecked;
  }
  else {
    lVar3 = *(long *)(in_RDI + 8);
    local_59 = 0;
    if ((((*(byte *)(in_RDI + 0x2554) & 1) != 0) &&
        (local_59 = 0, (*(byte *)(in_RDI + 0x2555) & 1) != 0)) &&
       (local_59 = 0, (*(byte *)(in_RDI + 0x2556) & 1) != 0)) {
      local_59 = *(byte *)(in_RDI + 0x2558);
    }
    if ((local_59 & 1) == 0) {
      if ((*(byte *)(in_RDI + 0x2554) & 1) == 0) {
        highsLogDev((HighsLogOptions *)(lVar3 + 0x380),kError,
                    "Not OK to solve since status.has_basis = %d\n",
                    (ulong)(*(byte *)(in_RDI + 0x2554) & 1));
      }
      if ((*(byte *)(in_RDI + 0x2555) & 1) == 0) {
        highsLogDev((HighsLogOptions *)(lVar3 + 0x380),kError,
                    "Not OK to solve since status.has_ar_matrix = %d\n",
                    (ulong)(*(byte *)(in_RDI + 0x2555) & 1));
      }
      if ((*(byte *)(in_RDI + 0x2556) & 1) == 0) {
        highsLogDev((HighsLogOptions *)(lVar3 + 0x380),kError,
                    "Not OK to solve since status.has_nla = %d\n",
                    (ulong)(*(byte *)(in_RDI + 0x2556) & 1));
      }
      if ((*(byte *)(in_RDI + 0x2557) & 1) == 0) {
        highsLogDev((HighsLogOptions *)(lVar3 + 0x380),kError,
                    "Not OK to solve since status.has_dual_steepest_edge_weights = %d\n",
                    (ulong)(*(byte *)(in_RDI + 0x2557) & 1));
      }
      if ((*(byte *)(in_RDI + 0x2558) & 1) == 0) {
        highsLogDev((HighsLogOptions *)(lVar3 + 0x380),kError,
                    "Not OK to solve since status.has_invert = %d\n",
                    (ulong)(*(byte *)(in_RDI + 0x2558) & 1));
      }
    }
    if (*(int *)(*(long *)(in_RDI + 8) + 0x15c) < 2) {
      HVar6 = kOk;
    }
    else {
      HVar6 = debugBasisConsistent
                        ((HEkk *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (HVar6 == kLogicalError) {
        HVar6 = kLogicalError;
      }
      else {
        bVar4 = debugWorkArraysOk(in_stack_00000108,in_stack_00000104,in_stack_00000100);
        if (bVar4) {
          iVar1 = *(int *)(in_RDI + 0x2198);
          iVar2 = *(int *)(in_RDI + 0x219c);
          for (local_4c = 0; local_4c < iVar1 + iVar2; local_4c = local_4c + 1) {
            pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                (in_RDI + 0x2990),(long)local_4c);
            if ((*pvVar5 != '\0') &&
               (bVar4 = debugOneNonbasicMoveVsWorkArraysOk(in_stack_00000168,in_stack_00000164),
               !bVar4)) {
              return kLogicalError;
            }
          }
          HVar6 = kOk;
        }
        else {
          HVar6 = kLogicalError;
        }
      }
    }
  }
  return HVar6;
}

Assistant:

HighsDebugStatus HEkk::debugOkForSolve(const SimplexAlgorithm algorithm,
                                       const HighsInt phase) const {
  if (this->options_->highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  const HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const HighsLp& lp = this->lp_;
  const HighsSimplexStatus& status = this->status_;
  const SimplexBasis& basis = this->basis_;
  const HighsOptions& options = *this->options_;
  bool ok;
  // Minimal check - just look at flags. This means we trust them!
  ok = status.has_basis && status.has_ar_matrix && status.has_nla &&
       //       status.has_dual_steepest_edge_weights &&
       status.has_invert;
  if (!ok) {
    if (!status.has_basis)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_basis = "
                  "%" HIGHSINT_FORMAT "\n",
                  status.has_basis);
    if (!status.has_ar_matrix)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_ar_matrix = "
                  "%" HIGHSINT_FORMAT "\n",
                  status.has_ar_matrix);
    if (!status.has_nla)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_nla "
                  "= %" HIGHSINT_FORMAT "\n",
                  status.has_nla);
    if (!status.has_dual_steepest_edge_weights)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since "
                  "status.has_dual_steepest_edge_weights = %" HIGHSINT_FORMAT
                  "\n",
                  status.has_dual_steepest_edge_weights);
    if (!status.has_invert)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_invert = "
                  "%" HIGHSINT_FORMAT "\n",
                  status.has_invert);
  }
  if (this->options_->highs_debug_level < kHighsDebugLevelCostly)
    return return_status;
  // Basis and data check
  if (this->debugBasisConsistent() == HighsDebugStatus::kLogicalError)
    return HighsDebugStatus::kLogicalError;
  // Check work cost, lower, upper and range
  if (!this->debugWorkArraysOk(algorithm, phase))
    return HighsDebugStatus::kLogicalError;
  const HighsInt numTot = lp.num_col_ + lp.num_row_;
  // Check nonbasic move against work cost, lower, upper and range
  for (HighsInt var = 0; var < numTot; ++var) {
    if (basis.nonbasicFlag_[var]) {
      // Nonbasic variable
      if (!this->debugOneNonbasicMoveVsWorkArraysOk(var))
        return HighsDebugStatus::kLogicalError;
    }
  }
  return return_status;
}